

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O2

int IPdr_ManCheckClauses(Pdr_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Pdr_Set_t *pCube;
  int i;
  ulong uVar3;
  int i_00;
  ulong uVar4;
  
  iVar1 = p->vSolvers->nSize;
  uVar4 = 1;
  do {
    i_00 = (int)uVar4;
    if (iVar1 <= i_00) {
      return 1;
    }
    p_00 = Vec_VecEntry(p->vClauses,i_00);
    uVar3 = 0;
    while (i = (int)uVar3, i < p_00->nSize) {
      pCube = (Pdr_Set_t *)Vec_PtrEntry(p_00,i);
      iVar2 = Pdr_ManCheckCube(p,i_00 + -1,pCube,(Pdr_Set_t **)0x0,0,0,1);
      if (iVar2 == 0) {
        printf("Cube[%d][%d] not inductive!\n",uVar4,uVar3);
      }
      else if (iVar2 == -1) {
        return -1;
      }
      uVar3 = (ulong)(i + 1);
    }
    uVar4 = (ulong)(i_00 + 1);
  } while( true );
}

Assistant:

int IPdr_ManCheckClauses( Pdr_Man_t * p )
{
    Pdr_Set_t * pCubeK;
    Vec_Ptr_t * vArrayK;
    int j, k, RetValue, kMax = Vec_PtrSize(p->vSolvers);
    int iStartFrame = 1;
    int counter = 0;

    Vec_VecForEachLevelStartStop( p->vClauses, vArrayK, k, iStartFrame, kMax )
    {
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
        {
            ++counter;
            RetValue = Pdr_ManCheckCube( p, k - 1, pCubeK, NULL, 0, 0, 1 );

            if ( !RetValue ) {
                printf( "Cube[%d][%d] not inductive!\n", k, j );
            }

            if ( RetValue == -1 )
                return -1;
        }
    }

    return 1;
}